

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Histogram(HistogramForm4 Histogram)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  code *in_RDI;
  byte bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  uint32_t *in_stack_ffffffffffffff30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  Image *in_stack_ffffffffffffff40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  undefined4 uVar5;
  uint32_t height;
  undefined8 in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  int local_7c;
  int local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined1 local_60 [40];
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  uVar1 = (uint)local_9;
  height = (uint32_t)((ulong)local_60 >> 0x20);
  uVar5 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             (uint8_t)((ulong)in_stack_ffffffffffffff30 >> 0x38),
             (uint8_t)((ulong)in_stack_ffffffffffffff30 >> 0x30));
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_ffffffffffffff58 >> 0x38),(uint32_t)in_stack_ffffffffffffff58
             ,height,(Image *)CONCAT44(uVar5,uVar1));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d714f);
  Unit_Test::generateRoi
            (in_stack_ffffffffffffff40,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (uint32_t *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (uint32_t *)0x1d7170);
  this = &local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d7181);
  (*local_8)(local_38,local_70,local_74,local_78,local_7c,this);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98);
  bVar4 = false;
  if (sVar2 == 0x100) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_98,(ulong)local_9);
    bVar4 = false;
    if (*pvVar3 == local_78 * local_7c) {
      __first._M_current = (uint *)&local_98;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      __last._M_current._7_1_ = in_stack_ffffffffffffff2f;
      __last._M_current._0_7_ = in_stack_ffffffffffffff28;
      uVar1 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                        (__first,__last,0);
      bVar4 = uVar1 == local_78 * local_7c;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d725f);
  return (bool)(bVar4 & 1);
}

Assistant:

bool form4_Histogram(HistogramForm4 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        std::vector < uint32_t > histogram;
        Histogram( input, roiX, roiY, roiWidth, roiHeight, histogram );

        return histogram.size() == 256u && histogram[intensity] == roiWidth * roiHeight &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * roiHeight;
    }